

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.cpp
# Opt level: O0

void slang::ast::CheckerInstanceSymbol::fromSyntax
               (CheckerSymbol *checker,HierarchyInstantiationSyntax *syntax,ASTContext *context,
               SmallVectorBase<const_slang::ast::Symbol_*> *results,
               SmallVectorBase<const_slang::ast::Symbol_*> *implicitNets,
               bitmask<slang::ast::InstanceFlags> flags)

{
  bool in_stack_000002a7;
  SmallVectorBase<const_slang::ast::Symbol_*> *in_stack_000002a8;
  SmallVectorBase<const_slang::ast::Symbol_*> *in_stack_000002b0;
  ASTContext *in_stack_000002b8;
  HierarchyInstantiationSyntax *in_stack_000002c0;
  CheckerSymbol *in_stack_000002c8;
  bitmask<slang::ast::InstanceFlags> in_stack_000002d7;
  
  anon_unknown_292::createCheckers<slang::syntax::HierarchyInstantiationSyntax>
            (in_stack_000002c8,in_stack_000002c0,in_stack_000002b8,in_stack_000002b0,
             in_stack_000002a8,in_stack_000002a7,in_stack_000002d7);
  return;
}

Assistant:

void CheckerInstanceSymbol::fromSyntax(const CheckerSymbol& checker,
                                       const HierarchyInstantiationSyntax& syntax,
                                       const ASTContext& context,
                                       SmallVectorBase<const Symbol*>& results,
                                       SmallVectorBase<const Symbol*>& implicitNets,
                                       bitmask<InstanceFlags> flags) {
    createCheckers(checker, syntax, context, results, implicitNets,
                   /* isProcedural */ false, flags);
}